

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double cosine_cdf(double x,double a,double b)

{
  double __x;
  double dVar1;
  double y;
  double r8_pi;
  double cdf;
  double b_local;
  double a_local;
  double x_local;
  
  r8_pi = 0.0;
  if (b * -3.141592653589793 + a < x) {
    if (b * 3.141592653589793 + a < x) {
      if (b * 3.141592653589793 + a < x) {
        r8_pi = 1.0;
      }
    }
    else {
      __x = (x - a) / b;
      dVar1 = sin(__x);
      r8_pi = (__x + dVar1) / 6.283185307179586 + 0.5;
    }
  }
  else {
    r8_pi = 0.0;
  }
  return r8_pi;
}

Assistant:

double cosine_cdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    COSINE_CDF evaluates the Cosine CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameter of the PDF.
//    0.0 < B.
//
//    Output, double CDF, the value of the CDF.
//
{
  double cdf = 0.0;
  const double r8_pi = 3.14159265358979323;
  double y;

  if ( x <= a - r8_pi * b )
  {
    cdf = 0.0;
  }
  else if ( x <= a + r8_pi * b )
  {
    y = ( x - a ) / b;

    cdf = 0.5 + ( y + sin ( y ) ) / ( 2.0 * r8_pi );
  }
  else if ( a + r8_pi * b < x )
  {
    cdf = 1.0;
  }

  return cdf;
}